

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

HullError __thiscall
ConvexDecomposition::HullLibrary::CreateConvexHull
          (HullLibrary *this,HullDesc *desc,HullResult *result)

{
  undefined8 uVar1;
  uint uVar2;
  uint *__src;
  bool bVar3;
  ulong uVar4;
  float *vertices;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  HullError HVar11;
  HullLibrary *pHVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  uint ovcount;
  float scale [3];
  uint local_84;
  float *local_80;
  size_t local_78;
  float *local_70;
  HullResult *local_68;
  PHullResult local_60;
  float local_40 [2];
  float local_38;
  
  local_60.mVcount = 0;
  local_60.mIndexCount = 0;
  local_60.mFaceCount = 0;
  local_60.mVertices = (float *)0x0;
  local_60.mIndices = (uint *)0x0;
  uVar2 = desc->mVcount;
  uVar4 = 8;
  if (8 < uVar2) {
    uVar4 = (ulong)uVar2;
  }
  pHVar12 = (HullLibrary *)(uVar4 * 0xc);
  vertices = (float *)malloc((size_t)pHVar12);
  bVar3 = CleanupVertices(pHVar12,uVar2,desc->mVertices,desc->mVertexStride,&local_84,vertices,
                          desc->mNormalEpsilon,local_40);
  HVar11 = QE_FAIL;
  if (bVar3) {
    if ((ulong)local_84 != 0) {
      uVar4 = 0;
      do {
        uVar9 = uVar4 & 0xffffffff;
        uVar4 = uVar4 + 3;
        auVar14._0_4_ = local_40[0] * (float)*(undefined8 *)(vertices + uVar9);
        auVar14._4_4_ = local_40[1] * (float)((ulong)*(undefined8 *)(vertices + uVar9) >> 0x20);
        auVar14._8_8_ = 0;
        uVar1 = vmovlps_avx(auVar14);
        *(undefined8 *)(vertices + uVar9) = uVar1;
        vertices[uVar9 + 2] = local_38 * vertices[uVar9 + 2];
      } while ((ulong)local_84 * 3 != uVar4);
    }
    bVar3 = ComputeHull(local_84,vertices,&local_60,desc->mMaxVertices,
                        (float)((uint)((desc->mFlags & 4) != 0) * (int)desc->mSkinWidth));
    if (bVar3) {
      uVar2 = local_60.mVcount;
      pHVar12 = (HullLibrary *)((local_60._0_8_ & 0xffffffff) * 0xc);
      local_70 = (float *)malloc((size_t)pHVar12);
      __src = local_60.mIndices;
      uVar10 = local_60.mIndexCount;
      uVar4 = (ulong)local_60.mIndexCount;
      BringOutYourDead(pHVar12,local_60.mVertices,uVar2,local_70,&local_84,local_60.mIndices,
                       local_60.mIndexCount);
      uVar2 = desc->mFlags;
      local_68 = result;
      if ((uVar2 & 1) == 0) {
        result->mPolygons = true;
        result->mNumOutputVertices = local_84;
        local_78 = (ulong)local_84 * 0xc;
        local_80 = (float *)malloc(local_78);
        uVar13 = local_60.mFaceCount;
        result->mOutputVertices = local_80;
        uVar10 = uVar10 + local_60.mFaceCount;
        result->mNumFaces = local_60.mFaceCount;
        result->mNumIndices = uVar10;
        puVar5 = (uint *)malloc((ulong)uVar10 << 2);
        local_68->mIndices = puVar5;
        memcpy(local_80,local_70,local_78);
        if (uVar13 != 0) {
          puVar5 = puVar5 + 2;
          puVar6 = __src;
          do {
            puVar5[-2] = 3;
            if ((uVar2 & 2) == 0) {
              puVar5[-1] = *puVar6;
              *puVar5 = puVar6[1];
              puVar8 = puVar6 + 2;
            }
            else {
              puVar5[-1] = puVar6[2];
              *puVar5 = puVar6[1];
              puVar8 = puVar6;
            }
            puVar6 = puVar6 + 3;
            puVar5[1] = *puVar8;
            puVar5 = puVar5 + 4;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      else {
        result->mPolygons = false;
        result->mNumOutputVertices = local_84;
        local_78 = (ulong)local_84 * 0xc;
        local_80 = (float *)malloc(local_78);
        uVar13 = local_60.mFaceCount;
        result->mOutputVertices = local_80;
        result->mNumFaces = local_60.mFaceCount;
        result->mNumIndices = uVar10;
        puVar5 = (uint *)malloc(uVar4 * 4);
        local_68->mIndices = puVar5;
        memcpy(local_80,local_70,local_78);
        if ((uVar2 & 2) == 0) {
          memcpy(puVar5,__src,uVar4 * 4);
        }
        else if (uVar13 != 0) {
          lVar7 = 0;
          do {
            *(undefined4 *)((long)puVar5 + lVar7) = *(undefined4 *)((long)__src + lVar7 + 8);
            *(undefined4 *)((long)puVar5 + lVar7 + 4) = *(undefined4 *)((long)__src + lVar7 + 4);
            *(undefined4 *)((long)puVar5 + lVar7 + 8) = *(undefined4 *)((long)__src + lVar7);
            lVar7 = lVar7 + 0xc;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      if (__src != (uint *)0x0) {
        free(__src);
      }
      HVar11 = QE_OK;
      if (local_70 != (float *)0x0) {
        free(local_70);
        HVar11 = QE_OK;
      }
    }
  }
  if (vertices != (float *)0x0) {
    free(vertices);
  }
  return HVar11;
}

Assistant:

HullError HullLibrary::CreateConvexHull(const HullDesc       &desc,           // describes the input request
																					HullResult           &result)         // contains the resulst
{
	HullError ret = QE_FAIL;


	PHullResult hr;

	unsigned int vcount = desc.mVcount;
	if ( vcount < 8 ) vcount = 8;

	float *vsource  = (float *) malloc( sizeof(float)*vcount*3);


	float scale[3];

	unsigned int ovcount;

	bool ok = CleanupVertices(desc.mVcount,desc.mVertices, desc.mVertexStride, ovcount, vsource, desc.mNormalEpsilon, scale ); // normalize point cloud, remove duplicates!

	if ( ok )
	{


		if ( 1 ) // scale vertices back to their original size.
		{
			for (unsigned int i=0; i<ovcount; i++)
			{
				float *v = &vsource[i*3];
				v[0]*=scale[0];
				v[1]*=scale[1];
				v[2]*=scale[2];
			}
		}

		float skinwidth = 0;
		if ( desc.HasHullFlag(QF_SKIN_WIDTH) )
			skinwidth = desc.mSkinWidth;

		ok = ComputeHull(ovcount,vsource,hr,desc.mMaxVertices,skinwidth);

		if ( ok )
		{

			// re-index triangle mesh so it refers to only used vertices, rebuild a new vertex table.
			float *vscratch = (float *) malloc( sizeof(float)*hr.mVcount*3);
			BringOutYourDead(hr.mVertices,hr.mVcount, vscratch, ovcount, hr.mIndices, hr.mIndexCount );

			ret = QE_OK;

			if ( desc.HasHullFlag(QF_TRIANGLES) ) // if he wants the results as triangle!
			{
				result.mPolygons          = false;
				result.mNumOutputVertices = ovcount;
				result.mOutputVertices    = (float *)malloc( sizeof(float)*ovcount*3);
				result.mNumFaces          = hr.mFaceCount;
				result.mNumIndices        = hr.mIndexCount;

				result.mIndices           = (unsigned int *) malloc( sizeof(unsigned int)*hr.mIndexCount);

				memcpy(result.mOutputVertices, vscratch, sizeof(float)*3*ovcount );

  			if ( desc.HasHullFlag(QF_REVERSE_ORDER) )
				{

					const unsigned int *source = hr.mIndices;
								unsigned int *dest   = result.mIndices;

					for (unsigned int i=0; i<hr.mFaceCount; i++)
					{
						dest[0] = source[2];
						dest[1] = source[1];
						dest[2] = source[0];
						dest+=3;
						source+=3;
					}

				}
				else
				{
					memcpy(result.mIndices, hr.mIndices, sizeof(unsigned int)*hr.mIndexCount);
				}
			}
			else
			{
				result.mPolygons          = true;
				result.mNumOutputVertices = ovcount;
				result.mOutputVertices    = (float *)malloc( sizeof(float)*ovcount*3);
				result.mNumFaces          = hr.mFaceCount;
				result.mNumIndices        = hr.mIndexCount+hr.mFaceCount;
				result.mIndices           = (unsigned int *) malloc( sizeof(unsigned int)*result.mNumIndices);
				memcpy(result.mOutputVertices, vscratch, sizeof(float)*3*ovcount );

				if ( 1 )
				{
					const unsigned int *source = hr.mIndices;
								unsigned int *dest   = result.mIndices;
					for (unsigned int i=0; i<hr.mFaceCount; i++)
					{
						dest[0] = 3;
						if ( desc.HasHullFlag(QF_REVERSE_ORDER) )
						{
							dest[1] = source[2];
							dest[2] = source[1];
							dest[3] = source[0];
						}
						else
						{
							dest[1] = source[0];
							dest[2] = source[1];
							dest[3] = source[2];
						}

						dest+=4;
						source+=3;
					}
				}
			}
			ReleaseHull(hr);
			if ( vscratch )
			{
				free(vscratch);
			}
		}
	}

	if ( vsource )
	{
		free(vsource);
	}


	return ret;
}